

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O0

bool __thiscall Http2::FrameReader::readHeader(FrameReader *this,QIODevice *socket)

{
  size_type sVar1;
  reference pvVar2;
  long lVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  int *in_RDI;
  qint64 chunkSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  if (sVar1 < 9) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_RSI,(size_type)this_00);
  }
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_stack_ffffffffffffffe0,(size_type)in_RDI);
  lVar3 = QIODevice::read((char *)in_RSI,(longlong)pvVar2);
  if (0 < lVar3) {
    *in_RDI = *in_RDI + (int)lVar3;
  }
  return *in_RDI == 9;
}

Assistant:

bool FrameReader::readHeader(QIODevice &socket)
{
    Q_ASSERT(offset < frameHeaderSize);

    auto &buffer = frame.buffer;
    if (buffer.size() < frameHeaderSize)
        buffer.resize(frameHeaderSize);

    const auto chunkSize = socket.read(reinterpret_cast<char *>(&buffer[offset]),
                                       frameHeaderSize - offset);
    if (chunkSize > 0)
        offset += chunkSize;

    return offset == frameHeaderSize;
}